

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_test.cc
# Opt level: O0

void __thiscall
xLearn::PARSER_TEST_Parse_libffm_no_y_Test::~PARSER_TEST_Parse_libffm_no_y_Test
          (PARSER_TEST_Parse_libffm_no_y_Test *this)

{
  void *in_RDI;
  
  ~PARSER_TEST_Parse_libffm_no_y_Test((PARSER_TEST_Parse_libffm_no_y_Test *)0x14dc68);
  operator_delete(in_RDI);
  return;
}

Assistant:

TEST(PARSER_TEST, Parse_libffm_no_y) {
  write_data(Kfilename, kStrFFMNoy);
  char* buffer = nullptr;
  uint64 size = ReadFileToMemory(Kfilename, &buffer);
  DMatrix matrix;
  FFMParser parser;
  parser.setLabel(false);
  parser.setSplitor(" ");
  parser.Parse(buffer, size, matrix, true);
  check(matrix, false, true);
  parser.Parse(buffer, size, matrix, false);
  check_double(matrix, false, true);
  parser.Parse(buffer, size, matrix, true);
  check(matrix, false, true);
  RemoveFile(Kfilename.c_str());
}